

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

bool google::protobuf::internal::InitProtobufDefaultsImpl(void)

{
  string *ptr;
  string *to_destroy;
  
  ptr = GlobalEmptyStringDynamicInit::Init_abi_cxx11_
                  ((GlobalEmptyStringDynamicInit *)fixed_address_empty_string);
  if (ptr != (string *)0x0) {
    OnShutdownDestroyString(ptr);
  }
  InitWeakDefaults();
  std::atomic<bool>::store((atomic<bool> *)&init_protobuf_defaults_state,true,memory_order_release);
  return true;
}

Assistant:

static bool InitProtobufDefaultsImpl() {
  if (auto* to_destroy = fixed_address_empty_string.Init()) {
    OnShutdownDestroyString(to_destroy);
  }
  InitWeakDefaults();


  init_protobuf_defaults_state.store(true, std::memory_order_release);
  return true;
}